

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O1

void __thiscall flatfile_tests::flatfile_flush::test_method(flatfile_flush *this)

{
  long lVar1;
  path dir;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  _List in_stack_fffffffffffffe38;
  undefined4 local_1bc;
  FlatFilePos local_1b8;
  long local_1b0;
  lazy_ostream local_1a8;
  undefined1 *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  bool out_of_space;
  undefined4 *local_160;
  undefined **local_158;
  undefined1 local_150;
  undefined1 *local_148;
  undefined4 **local_140;
  long *local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined1 *local_120;
  long **local_118;
  char *local_110;
  char *local_108;
  assertion_result local_100;
  path local_e8;
  path local_c0;
  FlatFileSeq seq;
  path data_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&data_dir.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir.super_path);
  dir.super_path._M_pathname._M_string_length = in_stack_fffffffffffffe20;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe18;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffe28;
  dir.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffe30;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       in_stack_fffffffffffffe38._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq,dir,(char *)&local_c0,0xec3ed7);
  std::filesystem::__cxx11::path::~path(&local_c0);
  local_e8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  FlatFileSeq::Allocate(&seq,(FlatFilePos *)&local_e8,1,&out_of_space);
  local_e8._M_pathname._M_dataplus._M_p = (pointer)0x100000000;
  FlatFileSeq::Flush(&seq,(FlatFilePos *)&local_e8,false);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x7a;
  file.m_begin = (iterator)&local_178;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_188,msg);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_1b8.nFile = 0;
  local_1b8.nPos = 1;
  FlatFileSeq::FileName((path *)&local_e8,&seq,&local_1b8);
  local_1b0 = std::filesystem::file_size(&local_e8);
  local_138 = &local_1b0;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == 100);
  local_160 = &local_1bc;
  local_1bc = 100;
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_108 = "";
  local_118 = &local_138;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_013d3cf0;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_013d3d30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_140 = &local_160;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_1a8,1,2,REQUIRE,0xec1a07,(size_t)&local_110,0x7a,&local_130,"100U",
             &local_158);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)&local_e8);
  local_e8._M_pathname._M_dataplus._M_p = (pointer)0x100000000;
  FlatFileSeq::Flush(&seq,(FlatFilePos *)&local_e8,true);
  file_00.m_end = (iterator)0x7e;
  file_00.m_begin = &stack0xfffffffffffffe30;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffe20,msg_00);
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_190 = "";
  local_1b8.nFile = 0;
  local_1b8.nPos = 1;
  FlatFileSeq::FileName((path *)&local_e8,&seq,&local_1b8);
  local_1b0 = std::filesystem::file_size(&local_e8);
  local_1bc = 1;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1b0 == 1);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_108 = "";
  local_138 = &local_1b0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_013d3cf0;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_160 = &local_1bc;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_013d3d30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = &local_160;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_1a8,1,2,REQUIRE,0xec1a07,(size_t)&local_110,0x7e,&local_130,"1U",
             &local_158);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)&local_e8);
  std::filesystem::__cxx11::path::~path((path *)&seq);
  std::filesystem::__cxx11::path::~path(&data_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_flush)
{
    const auto data_dir = m_args.GetDataDirBase();
    FlatFileSeq seq(data_dir, "a", 100);

    bool out_of_space;
    seq.Allocate(FlatFilePos(0, 0), 1, out_of_space);

    // Flush without finalize should not truncate file.
    seq.Flush(FlatFilePos(0, 1));
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 1))), 100U);

    // Flush with finalize should truncate file.
    seq.Flush(FlatFilePos(0, 1), true);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 1))), 1U);
}